

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.c
# Opt level: O0

int libssh2_session_disconnect_ex(LIBSSH2_SESSION *session,int reason,char *desc,char *lang)

{
  int iVar1;
  time_t start_time;
  time_t entry_time;
  int rc;
  char *lang_local;
  char *desc_local;
  int reason_local;
  LIBSSH2_SESSION *session_local;
  
  session->state = session->state & 0xfffffffe;
  session->state = session->state & 0xfffffffd;
  start_time = time((time_t *)0x0);
  do {
    iVar1 = session_disconnect(session,reason,desc,lang);
    if (iVar1 != -0x25) {
      return iVar1;
    }
    if (session == (LIBSSH2_SESSION *)0x0) {
      return -0x25;
    }
    if (session->api_block_mode == 0) {
      return -0x25;
    }
    iVar1 = _libssh2_wait_socket(session,start_time);
  } while (iVar1 == 0);
  return iVar1;
}

Assistant:

LIBSSH2_API int
libssh2_session_disconnect_ex(LIBSSH2_SESSION *session, int reason,
                              const char *desc, const char *lang)
{
    int rc;
    session->state &= ~LIBSSH2_STATE_INITIAL_KEX;
    session->state &= ~LIBSSH2_STATE_EXCHANGING_KEYS;
    BLOCK_ADJUST(rc, session,
                 session_disconnect(session, reason, desc, lang));

    return rc;
}